

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFileSystem.cpp
# Opt level: O2

bool __thiscall irr::io::CFileSystem::changeWorkingDirectoryTo(CFileSystem *this,path *newDirectory)

{
  int iVar1;
  bool bVar2;
  string<char> sStack_38;
  
  if (*(int *)&(this->super_IFileSystem).field_0x8 == 0) {
    core::string<char>::operator=
              ((string<char> *)&(this->super_IFileSystem).field_0x10,newDirectory);
    iVar1 = chdir((newDirectory->str)._M_dataplus._M_p);
    bVar2 = iVar1 == 0;
  }
  else {
    core::string<char>::operator=((string<char> *)&this->field_0x30,newDirectory);
    core::string<char>::string<char>(&sStack_38,"");
    (*(this->super_IFileSystem)._vptr_IFileSystem[0x16])(this,&this->field_0x30,&sStack_38);
    ::std::__cxx11::string::_M_dispose();
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool CFileSystem::changeWorkingDirectoryTo(const io::path &newDirectory)
{
	bool success = false;

	if (FileSystemType != FILESYSTEM_NATIVE) {
		WorkingDirectory[FILESYSTEM_VIRTUAL] = newDirectory;
		// is this empty string constant really intended?
		flattenFilename(WorkingDirectory[FILESYSTEM_VIRTUAL], _IRR_TEXT(""));
		success = true;
	} else {
		WorkingDirectory[FILESYSTEM_NATIVE] = newDirectory;

#if defined(_MSC_VER)
		success = (_chdir(newDirectory.c_str()) == 0);
#else
		success = (chdir(newDirectory.c_str()) == 0);
#endif
	}

	return success;
}